

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PopStyleColor(int count)

{
  ImVec4 *pIVar1;
  ImVec4 *pIVar2;
  ImGuiColorMod *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImGuiContext *pIVar7;
  long lVar8;
  
  pIVar7 = GImGui;
  for (; 0 < count; count = count + -1) {
    pIVar3 = (pIVar7->ColorModifiers).Data;
    lVar8 = (long)(pIVar7->ColorModifiers).Size;
    pIVar2 = &pIVar3[lVar8 + -1].BackupValue;
    fVar4 = pIVar2->y;
    fVar5 = pIVar2->z;
    fVar6 = pIVar2->w;
    pIVar1 = (pIVar7->Style).Colors + pIVar3[lVar8 + -1].Col;
    pIVar1->x = pIVar2->x;
    pIVar1->y = fVar4;
    pIVar1->z = fVar5;
    pIVar1->w = fVar6;
    (pIVar7->ColorModifiers).Size = (pIVar7->ColorModifiers).Size + -1;
  }
  return;
}

Assistant:

void ImGui::PopStyleColor(int count)
{
    ImGuiContext& g = *GImGui;
    while (count > 0)
    {
        ImGuiColorMod& backup = g.ColorModifiers.back();
        g.Style.Colors[backup.Col] = backup.BackupValue;
        g.ColorModifiers.pop_back();
        count--;
    }
}